

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SimpleAssignmentPatternExpression * __thiscall
slang::BumpAllocator::
emplace<slang::ast::SimpleAssignmentPatternExpression,slang::ast::Type_const&,bool,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
          (BumpAllocator *this,Type *args,bool *args_1,
          span<const_slang::ast::Expression_*,_18446744073709551615UL> *args_2,SourceRange *args_3)

{
  span<const_slang::ast::Expression_*const,_18446744073709551615UL> elements;
  SourceRange sourceRange;
  SimpleAssignmentPatternExpression *pSVar1;
  __extent_storage<18446744073709551615UL> in_RCX;
  undefined1 *in_RDX;
  SourceLocation in_RSI;
  SourceLocation in_RDI;
  pointer in_R8;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> *in_stack_ffffffffffffff98;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  BumpAllocator *in_stack_ffffffffffffffa8;
  Type *in_stack_ffffffffffffffc8;
  SimpleAssignmentPatternExpression *in_stack_ffffffffffffffd0;
  
  pSVar1 = (SimpleAssignmentPatternExpression *)
           allocate(in_stack_ffffffffffffffa8,
                    CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                    (size_t)in_stack_ffffffffffffff98);
  std::span<const_slang::ast::Expression_*const,_18446744073709551615UL>::
  span<const_slang::ast::Expression_*,_18446744073709551615UL>
            ((span<const_slang::ast::Expression_*const,_18446744073709551615UL> *)
             CONCAT17(*in_RDX,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff98);
  elements._M_extent._M_extent_value = in_RCX._M_extent_value;
  elements._M_ptr = in_R8;
  sourceRange.endLoc = in_RDI;
  sourceRange.startLoc = in_RSI;
  slang::ast::SimpleAssignmentPatternExpression::SimpleAssignmentPatternExpression
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,SUB81((ulong)in_R8[1] >> 0x38,0),
             elements,sourceRange);
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }